

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualMulti.cpp
# Opt level: O0

void __thiscall HEkkDual::majorChooseRow(HEkkDual *this)

{
  double dVar1;
  long lVar2;
  reference pvVar3;
  reference pvVar4;
  long in_RDI;
  HighsInt iRow_2;
  HighsInt i_2;
  double kPamiCutoff;
  double updated_edge_weight;
  HighsInt iRow_1;
  HighsInt i_1;
  HighsInt countWrongEdWt;
  double local_row_ep_density;
  HighsInt ich_2;
  HighsInt ich_1;
  HighsInt ich;
  HighsInt iRow;
  HighsInt i;
  HighsInt choiceCount;
  HighsInt initialCount;
  vector<double,_std::allocator<double>_> *edge_weight;
  vector<int,_std::allocator<int>_> choiceIndex;
  HighsInt in_stack_ffffffffffffff1c;
  HighsInt *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  HEkkDualRHS *in_stack_ffffffffffffff30;
  undefined7 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3f;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  int iVar5;
  int local_50;
  int local_4c;
  pointer in_stack_ffffffffffffffe8;
  HEkkDualRHS *in_stack_fffffffffffffff0;
  
  if (*(int *)(*(long *)(in_RDI + 0x10) + 0x2944) == 0) {
    *(undefined4 *)(in_RDI + 0x14d4) = 1;
  }
  if (*(int *)(in_RDI + 0x14d4) != 0) {
    *(undefined4 *)(in_RDI + 0x14d4) = 0;
    *(int *)(in_RDI + 0x14d0) = *(int *)(in_RDI + 0x14d0) + 1;
    std::allocator<int>::allocator((allocator<int> *)0x78f721);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
               CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38),
               (value_type_conflict2 *)in_stack_ffffffffffffff30,
               (allocator_type *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    std::allocator<int>::~allocator((allocator<int> *)0x78f74f);
    lVar2 = *(long *)(in_RDI + 0x10);
    while( true ) {
      std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x78f78e);
      HEkkDualRHS::chooseMultiHyperGraphAuto
                (in_stack_ffffffffffffff30,
                 (HighsInt *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                 in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
      if ((*(double *)(in_RDI + 0x720) == 0.0) && (!NAN(*(double *)(in_RDI + 0x720)))) break;
      local_4c = 0;
      for (local_50 = 0; local_50 < 0; local_50 = local_50 + 1) {
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)&stack0xffffffffffffffe0,
                            (long)local_50);
        iVar5 = *pvVar3;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x760),(long)iVar5)
        ;
        dVar1 = *pvVar4;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(lVar2 + 0x2a20),(long)iVar5)
        ;
        if (*(double *)(in_RDI + 0x720) <= dVar1 / *pvVar4) {
          pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)&stack0xffffffffffffffe0,
                              (long)local_4c);
          *pvVar3 = iVar5;
          local_4c = local_4c + 1;
        }
      }
      HEkkDualRHS::createInfeasList(in_stack_fffffffffffffff0,(double)in_stack_ffffffffffffffe8);
    }
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff30);
  }
  return;
}

Assistant:

void HEkkDual::majorChooseRow() {
  /**
   * 0. Initial check to see if we need to do it again
   */
  if (ekk_instance_.info_.update_count == 0) multi_chooseAgain = 1;
  if (!multi_chooseAgain) return;
  multi_chooseAgain = 0;
  multi_iteration++;
  /**
   * Major loop:
   *     repeat 1-5, until we found a good sets of choices
   */
  std::vector<HighsInt> choiceIndex(multi_num, 0);
  std::vector<double>& edge_weight = ekk_instance_.dual_edge_weight_;
  for (;;) {
    // 1. Multiple CHUZR
    HighsInt initialCount = 0;

    // Call the hyper-graph method, but partSwitch=0 so just uses
    // choose_multi_global
    dualRHS.chooseMultiHyperGraphAuto(choiceIndex.data(), &initialCount,
                                      multi_num);
    // dualRHS.chooseMultiGlobal(choiceIndex.data(), &initialCount, multi_num);
    if (initialCount == 0 && dualRHS.workCutoff == 0) {
      // OPTIMAL
      return;
    }

    // 2. Shrink the size by cutoff
    HighsInt choiceCount = 0;
    for (HighsInt i = 0; i < initialCount; i++) {
      HighsInt iRow = choiceIndex[i];
      if (dualRHS.work_infeasibility[iRow] / edge_weight[iRow] >=
          dualRHS.workCutoff) {
        choiceIndex[choiceCount++] = iRow;
      }
    }

    if (initialCount == 0 || choiceCount <= initialCount / 3) {
      // Need to do the list again
      dualRHS.createInfeasList(ekk_instance_.info_.col_aq_density);
      continue;
    }

    // 3. Store the choiceIndex to buffer
    for (HighsInt ich = 0; ich < multi_num; ich++)
      multi_choice[ich].row_out = kNoRowChosen;
    for (HighsInt ich = 0; ich < choiceCount; ich++)
      multi_choice[ich].row_out = choiceIndex[ich];

    // 4. Parallel BTRAN and compute weight
    majorChooseRowBtran();

    // 5. Update row densities
    for (HighsInt ich = 0; ich < multi_num; ich++) {
      if (multi_choice[ich].row_out >= 0) {
        const double local_row_ep_density =
            (double)multi_choice[ich].row_ep.count / solver_num_row;
        ekk_instance_.updateOperationResultDensity(
            local_row_ep_density, ekk_instance_.info_.row_ep_density);
      }
    }

    if (edge_weight_mode == EdgeWeightMode::kSteepestEdge) {
      // 6. Check updated and computed weight - just for dual steepest edge
      HighsInt countWrongEdWt = 0;
      for (HighsInt i = 0; i < multi_num; i++) {
        const HighsInt iRow = multi_choice[i].row_out;
        if (iRow < 0) continue;
        double updated_edge_weight = edge_weight[iRow];
        computed_edge_weight = edge_weight[iRow] = multi_choice[i].infeasEdWt;
        //      if (updated_edge_weight < 0.25 * computed_edge_weight) {
        if (!acceptDualSteepestEdgeWeight(updated_edge_weight)) {
          multi_choice[i].row_out = kNoRowChosen;
          countWrongEdWt++;
        }
      }
      if (countWrongEdWt <= choiceCount / 3) break;
    } else {
      // No checking required if not using dual steepest edge so break
      break;
    }
  }

  // 6. Take other info associated with choices
  multi_chosen = 0;
  const double kPamiCutoff = 0.95;
  for (HighsInt i = 0; i < multi_num; i++) {
    const HighsInt iRow = multi_choice[i].row_out;
    if (iRow < 0) continue;
    multi_chosen++;
    // Other info
    multi_choice[i].baseValue = baseValue[iRow];
    multi_choice[i].baseLower = baseLower[iRow];
    multi_choice[i].baseUpper = baseUpper[iRow];
    multi_choice[i].infeasValue = dualRHS.work_infeasibility[iRow];
    multi_choice[i].infeasEdWt = edge_weight[iRow];
    multi_choice[i].infeasLimit =
        dualRHS.work_infeasibility[iRow] / edge_weight[iRow];
    multi_choice[i].infeasLimit *= kPamiCutoff;
  }

  // 6. Finish count
  multi_nFinish = 0;
}